

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

void baryonyx::itm::
     init_with_pre_solve<baryonyx::itm::quadratic_cost_type<long_double>,baryonyx::itm::maximize_tag>
               (bit_array *x_pessimistic,bit_array *x_optimistic,random_engine *rng,
               quadratic_cost_type<long_double> *c,
               vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               *constraints,double init_random)

{
  ulong uVar1;
  pointer prVar2;
  merged_constraint *cst;
  pointer pmVar3;
  pointer pfVar4;
  size_type __n;
  function_element fVar5;
  function_element fVar6;
  long lVar7;
  long lVar8;
  merged_constraint *cst_1;
  pointer pmVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int *piVar13;
  ulong uVar14;
  pointer prVar15;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  double dVar19;
  allocator_type local_81;
  vector<reduced_cost,_std::allocator<reduced_cost>_> R;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_double>
  __aurng;
  
  __n = 0;
  for (pmVar3 = (constraints->
                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pmVar3 != (constraints->
                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                )._M_impl.super__Vector_impl_data._M_finish; pmVar3 = pmVar3 + 1) {
    uVar11 = (ulong)((long)(pmVar3->elements).
                           super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pmVar3->elements).
                          super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3;
    uVar17 = uVar11 & 0xffffffff;
    if ((int)uVar11 < (int)__n) {
      uVar17 = __n;
    }
    __n = uVar17;
  }
  std::vector<reduced_cost,_std::allocator<reduced_cost>_>::vector(&R,__n,&local_81);
  pmVar3 = (constraints->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pmVar9 = (constraints->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pmVar9 == pmVar3) {
      std::_Vector_base<reduced_cost,_std::allocator<reduced_cost>_>::~_Vector_base
                (&R.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>);
      return;
    }
    dVar19 = std::
             generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                       (rng);
    if (dVar19 < init_random) {
      std::vector<reduced_cost,_std::allocator<reduced_cost>_>::resize
                (&R,(long)(pmVar9->elements).
                          super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pmVar9->elements).
                          super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3);
      pfVar4 = (pmVar9->elements).
               super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
               ._M_impl.super__Vector_impl_data._M_start;
      fVar5 = (function_element)
              ((long)(pmVar9->elements).
                     super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar4);
      uVar17 = (ulong)fVar5 >> 3 & 0xffffffff;
      lVar8 = 4;
      fVar6 = fVar5;
      for (uVar11 = 0; uVar17 != uVar11; uVar11 = uVar11 + 1) {
        quadratic_cost_type<long_double>::operator[]
                  ((longdouble *)c,
                   (quadratic_cost_type<long_double> *)(ulong)(uint)pfVar4[uVar11].variable_index,
                   fVar6.factor);
        *(float *)((long)R.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar8 + -4) = (float)in_ST0;
        pfVar4 = (pmVar9->elements).
                 super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        fVar6 = pfVar4[uVar11];
        *(function_element *)
         ((long)&(R.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
                  super__Vector_impl_data._M_start)->value + lVar8) = fVar6;
        lVar8 = lVar8 + 0xc;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
      }
      std::
      shuffle<__gnu_cxx::__normal_iterator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<long_double>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<long_double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost*,std::vector<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<long_double>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<long_double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost,std::allocator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<long_double>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<long_double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                ((__normal_iterator<reduced_cost_*,_std::vector<reduced_cost,_std::allocator<reduced_cost>_>_>
                  )R.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
                   super__Vector_impl_data._M_start,
                 (__normal_iterator<reduced_cost_*,_std::vector<reduced_cost,_std::allocator<reduced_cost>_>_>
                  )R.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
                   super__Vector_impl_data._M_finish,rng);
      std::
      __sort<__gnu_cxx::__normal_iterator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<long_double>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<long_double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost*,std::vector<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<long_double>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<long_double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost,std::allocator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<long_double>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<long_double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<long_double>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<long_double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                (R.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if ((x_pessimistic->super_bit_array_impl).m_data._M_t.
          super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
          super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
        iVar10 = 0;
        lVar7 = (long)(int)((ulong)fVar5 >> 3);
        lVar8 = -1;
        do {
          piVar13 = &R.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar8].factor;
          do {
            if (lVar7 <= lVar8) {
              lVar8 = -2;
LAB_001902d6:
              lVar7 = 8;
              uVar11 = uVar17;
              for (lVar16 = 0; lVar16 <= (int)lVar8; lVar16 = lVar16 + 1) {
                bit_array_impl::set(&x_pessimistic->super_bit_array_impl,
                                    *(int *)((long)&(R.
                                                  super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->value
                                            + lVar7));
                lVar7 = lVar7 + 0xc;
                uVar11 = uVar11 - 1;
              }
              while (bVar18 = uVar11 != 0, uVar11 = uVar11 - 1, bVar18) {
                bit_array_impl::unset
                          (&x_pessimistic->super_bit_array_impl,
                           *(int *)((long)&(R.
                                            super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->value +
                                   lVar7));
                lVar7 = lVar7 + 0xc;
              }
              goto LAB_00190328;
            }
            if ((pmVar9->min <= iVar10) && (iVar10 <= pmVar9->max)) goto LAB_001902d6;
            lVar8 = lVar8 + 1;
            piVar13 = piVar13 + 3;
          } while (lVar7 <= lVar8);
          iVar10 = iVar10 + *piVar13;
        } while( true );
      }
LAB_00190328:
      if ((x_optimistic->super_bit_array_impl).m_data._M_t.
          super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
          super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
        iVar10 = 0;
        lVar8 = (long)(int)((ulong)fVar5 >> 3);
        uVar11 = 0xffffffffffffffff;
        uVar14 = 0xfffffffffffffffe;
        do {
          prVar2 = R.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar11 + 1;
          do {
            prVar15 = prVar2;
            iVar12 = (int)uVar14;
            if (lVar8 <= (long)uVar11) {
LAB_001903a3:
              lVar8 = 8;
              for (lVar7 = 0; lVar7 <= iVar12; lVar7 = lVar7 + 1) {
                bit_array_impl::set(&x_optimistic->super_bit_array_impl,
                                    *(int *)((long)&(R.
                                                  super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->value
                                            + lVar8));
                lVar8 = lVar8 + 0xc;
                uVar17 = uVar17 - 1;
              }
              while (bVar18 = uVar17 != 0, uVar17 = uVar17 - 1, bVar18) {
                bit_array_impl::unset
                          (&x_optimistic->super_bit_array_impl,
                           *(int *)((long)&(R.
                                            super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->value +
                                   lVar8));
                lVar8 = lVar8 + 0xc;
              }
              goto LAB_001903f2;
            }
            uVar1 = uVar11;
            if (pmVar9->max < iVar10) {
              uVar1 = uVar14;
            }
            if (iVar10 < pmVar9->min) {
              uVar1 = uVar14;
            }
            uVar14 = uVar1 & 0xffffffff;
            uVar11 = uVar11 + 1;
            iVar12 = (int)uVar1;
            if (((iVar12 != -2) && ((long)uVar11 < lVar8)) && (prVar15->value < 0.0))
            goto LAB_001903a3;
            prVar2 = prVar15 + 1;
          } while (lVar8 <= (long)uVar11);
          iVar10 = iVar10 + prVar15->factor;
        } while( true );
      }
    }
LAB_001903f2:
    pmVar9 = pmVar9 + 1;
  } while( true );
}

Assistant:

void
init_with_pre_solve(bit_array& x_pessimistic,
                    bit_array& x_optimistic,
                    random_engine& rng,
                    const Cost& c,
                    const std::vector<merged_constraint>& constraints,
                    const double init_random) noexcept
{
    int max_length = 0;
    for (const auto& cst : constraints)
        if (length(cst.elements) > max_length)
            max_length = length(cst.elements);

    struct reduced_cost
    {
        float value;
        int factor;
        int id;
    };

    std::vector<reduced_cost> R(max_length);
    std::bernoulli_distribution dist(init_random);

    for (const auto& cst : constraints) {
        if (!dist(rng))
            continue;

        R.resize(cst.elements.size());
        const int r_size = length(cst.elements);

        for (int i = 0; i != r_size; ++i) {
            R[i].value = static_cast<float>(c[cst.elements[i].variable_index]);
            R[i].factor = cst.elements[i].factor;
            R[i].id = cst.elements[i].variable_index;
        }

        std::shuffle(std::begin(R), std::end(R), rng);
        std::sort(
          std::begin(R), std::end(R), [](const auto& lhs, const auto& rhs) {
              return is_better_solution<Mode>(lhs.value, rhs.value);
          });

        if (!x_pessimistic.empty()) {
            int sum = 0;
            int best = -2;

            for (int i = -1; i < r_size; ++i) {
                if (cst.min <= sum && sum <= cst.max) {
                    best = i;
                    break;
                }

                if (i + 1 < r_size)
                    sum += R[i + 1].factor;
            }

            int i = 0;
            for (; i <= best; ++i)
                x_pessimistic.set(R[i].id);

            for (; i != r_size; ++i) {
                x_pessimistic.unset(R[i].id);
            }
        }

        if (!x_optimistic.empty()) {
            int sum = 0;
            int best = -2;

            for (int i = -1; i < r_size; ++i) {
                if (cst.min <= sum && sum <= cst.max)
                    best = i;

                if (best != -2 && i + 1 < r_size &&
                    stop_iterating<Mode>(R[i + 1].value))
                    break;

                if (i + 1 < r_size)
                    sum += R[i + 1].factor;
            }

            int i = 0;
            for (; i <= best; ++i)
                x_optimistic.set(R[i].id);

            for (; i != r_size; ++i)
                x_optimistic.unset(R[i].id);
        }
    }
}